

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterCommon.h
# Opt level: O2

void PixelToaster::magical_strcpy<256>(char (*dest) [256],char *src)

{
  uint i;
  long lVar1;
  
  for (lVar1 = 0; (lVar1 != 0xff && (src[lVar1] != '\0')); lVar1 = lVar1 + 1) {
    (*dest)[lVar1] = src[lVar1];
  }
  (*dest)[lVar1] = '\0';
  return;
}

Assistant:

inline void magical_strcpy(char (&dest)[n], const char src[])
{
    unsigned int i = 0;
    while (i < n - 1)
    {
        if (src[i] == 0)
            break;
        dest[i] = src[i];
        i++;
    }
    dest[i] = 0;
}